

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O1

int __thiscall
capnp::_::anon_unknown_0::TestVat::connect(TestVat *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Entry **ppEVar1;
  Entry *pEVar2;
  HashBucket *pHVar3;
  size_t sVar4;
  size_t __n;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  bool bVar7;
  Connection *pCVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  int iVar11;
  uint uVar12;
  HashBucket *pHVar13;
  size_t sVar14;
  TestVat *params;
  undefined4 in_register_00000034;
  bool *params_3;
  char *in_R9;
  TestNetwork *pTVar15;
  TestVat *params_1;
  ulong uVar16;
  ulong uVar17;
  StringPtr *pSVar18;
  Reader RVar19;
  ArrayPtr<const_unsigned_char> s;
  SegmentReader *in_stack_00000008;
  CapTableReader *in_stack_00000010;
  byte *in_stack_00000018;
  WirePointer *in_stack_00000020;
  int in_stack_00000028;
  short in_stack_0000002c;
  int in_stack_00000030;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> remote;
  Own<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,_std::nullptr_t> local;
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>_&,_const_kj::None_&>
  _kjCondition;
  DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl_&>_&,_const_kj::None_&>
  *in_stack_ffffffffffffff18;
  bool local_c9;
  Fault local_c8;
  TestNetwork *local_c0;
  TestVat *local_b8;
  TestVat *local_b0;
  Disposer *local_a8;
  Connection *local_a0;
  Fault local_98;
  undefined8 uStack_90;
  Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>
  local_88;
  PointerReader local_78;
  undefined1 local_58;
  size_t local_48;
  StringPtr *local_40;
  uchar *local_38;
  
  params = (TestVat *)CONCAT44(in_register_00000034,__fd);
  local_78.capTable = in_stack_00000010;
  local_78.pointer = in_stack_00000020;
  local_78.segment = in_stack_00000008;
  iVar11 = in_stack_00000030;
  if (in_stack_0000002c == 0) {
    local_78.capTable = (CapTableReader *)0x0;
    local_78.pointer = (WirePointer *)0x0;
    local_78.segment = (SegmentReader *)0x0;
    iVar11 = 0x7fffffff;
  }
  local_78.nestingLimit = iVar11;
  RVar19 = PointerReader::getBlob<capnp::Text>(&local_78,(void *)0x0,0);
  sVar14 = RVar19.super_StringPtr.content.size_;
  pSVar18 = &params->self;
  if ((sVar14 == (params->self).content.size_) &&
     ((sVar14 == 0 ||
      (iVar11 = bcmp(RVar19.super_StringPtr.content.ptr,(pSVar18->content).ptr,sVar14), iVar11 == 0)
      ))) {
    (this->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase = (_func_int **)0x0;
    this->network = (TestNetwork *)0x0;
    goto LAB_0020424f;
  }
  pTVar15 = params->network;
  if (in_stack_0000002c == 0) {
    in_stack_00000010 = (CapTableReader *)0x0;
    in_stack_00000030 = 0x7fffffff;
    in_stack_00000020 = (WirePointer *)0x0;
    in_stack_00000008 = (SegmentReader *)0x0;
  }
  local_78.nestingLimit = in_stack_00000030;
  local_78.segment = in_stack_00000008;
  local_78.capTable = in_stack_00000010;
  local_78.pointer = in_stack_00000020;
  local_40 = pSVar18;
  RVar19 = PointerReader::getBlob<capnp::Text>(&local_78,(void *)0x0,0);
  bVar7 = true;
  if ((pTVar15->map).table.indexes.buckets.size_ != 0) {
    pEVar2 = (pTVar15->map).table.rows.builder.ptr;
    s.size_ = RVar19.super_StringPtr.content.size_ - 1;
    s.ptr = RVar19.super_StringPtr.content.ptr;
    local_b8 = params;
    local_b0 = this;
    local_48 = RVar19.super_StringPtr.content.size_;
    local_38 = RVar19.super_StringPtr.content.ptr;
    uVar12 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
    pHVar3 = (pTVar15->map).table.indexes.buckets.ptr;
    sVar4 = (pTVar15->map).table.indexes.buckets.size_;
    uVar17 = (ulong)((int)sVar4 - 1U & uVar12);
    pSVar18 = (StringPtr *)(ulong)pHVar3[uVar17].value;
    local_c0 = pTVar15;
    if (pHVar3[uVar17].value != 0) {
      pHVar13 = pHVar3 + uVar17;
      sVar14 = local_48;
      do {
        if (((int)pSVar18 != 1) && (pHVar13->hash == uVar12)) {
          pSVar18 = (StringPtr *)(ulong)((int)pSVar18 - 2);
          __n = pEVar2[(long)pSVar18].key.content.size_;
          if ((__n == sVar14) &&
             ((__n == 0 ||
              (iVar11 = bcmp(pEVar2[(long)pSVar18].key.content.ptr,local_38,__n), sVar14 = local_48,
              iVar11 == 0)))) {
            bVar7 = false;
            params = local_b8;
            pTVar15 = local_c0;
            this = local_b0;
            goto LAB_0020403c;
          }
        }
        uVar16 = uVar17 + 1;
        uVar17 = uVar16 & 0xffffffff;
        if (uVar16 == sVar4) {
          uVar17 = 0;
        }
        pHVar13 = pHVar3 + uVar17;
        pSVar18 = (StringPtr *)(ulong)pHVar13->value;
      } while (pHVar13->value != 0);
    }
    bVar7 = true;
    params = local_b8;
    pTVar15 = local_c0;
    this = local_b0;
  }
LAB_0020403c:
  pEVar2 = (pTVar15->map).table.rows.builder.ptr;
  if (pEVar2 == (Entry *)0x0 || bVar7) {
    params_1 = (TestVat *)0x0;
  }
  else {
    params_1 = pEVar2[(long)pSVar18].value.ptr;
  }
  if (params_1 == (TestVat *)0x0) {
    local_98.exception = (Exception *)0x0;
    local_78.segment = (SegmentReader *)0x0;
    local_78.capTable = (CapTableReader *)0x0;
    kj::_::Debug::Fault::init
              (&local_98,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++"
              );
    kj::_::Debug::Fault::fatal(&local_98);
  }
  if (in_stack_00000028 == 0) {
    local_c9 = false;
LAB_0020407f:
    local_98.exception = (Exception *)params_1;
    kj::
    HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
    ::find<capnp::_::(anonymous_namespace)::TestVat*>
              ((HashMap<capnp::_::(anonymous_namespace)::TestVat_const*,capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl*>
                *)&local_78,(TestVat **)&params->connections);
    if (local_78.segment != (SegmentReader *)0x0) {
      pTVar15 = (TestNetwork *)(local_78.segment)->arena;
      ppEVar1 = &(pTVar15->dumper).schemas.table.rows.builder.endPtr;
      *(int *)ppEVar1 = *(int *)ppEVar1 + 1;
      (this->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase =
           (_func_int **)&(pTVar15->dumper).schemas.table.rows.builder.pos;
      this->network = pTVar15;
      goto LAB_0020424f;
    }
  }
  else {
    local_c9 = (bool)(*in_stack_00000018 & 1);
    if (local_c9 == false) goto LAB_0020407f;
  }
  params_3 = &local_c9;
  kj::
  refcounted<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,capnp::_::(anonymous_namespace)::TestVat&,capnp::_::(anonymous_namespace)::TestVat&,kj::StringPtr&,bool&>
            ((kj *)&local_98,params,params_1,local_40,params_3);
  kj::
  refcounted<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl,capnp::_::(anonymous_namespace)::TestVat&,capnp::_::(anonymous_namespace)::TestVat&,kj::StringPtr&,bool&>
            ((kj *)&local_a8,params_1,params,&params_1->self,params_3);
  local_78.segment = (SegmentReader *)(uStack_90 + 0x16);
  local_58 = uStack_90[0x16] == (_func_int *)0x0;
  local_78.capTable = (CapTableReader *)&kj::none;
  local_78.pointer = (WirePointer *)0x4fd0ae;
  local_78.nestingLimit = 5;
  local_78._28_4_ = 0;
  if (!(bool)local_58) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>&,kj::None_const&>&>
              (&local_c8,(char *)0x12a,0x52b22e,(Type)&local_78,params_3,in_R9,
               in_stack_ffffffffffffff18);
    kj::_::Debug::Fault::fatal(&local_c8);
  }
  local_58 = local_a0[0x16].super_Connection._vptr_Connection == (_func_int **)0x0;
  local_78.segment = (SegmentReader *)(local_a0 + 0x16);
  local_78.capTable = (CapTableReader *)&kj::none;
  local_78.pointer = (WirePointer *)0x4fd0ae;
  local_78.nestingLimit = 5;
  local_78._28_4_ = 0;
  if (!(bool)local_58) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<capnp::_::(anonymous_namespace)::TestVat::ConnectionImpl&>&,kj::None_const&>&>
              (&local_c8,(char *)0x12b,0x52b228,(Type)&local_78,params_3,in_R9,
               in_stack_ffffffffffffff18);
    kj::_::Debug::Fault::fatal(&local_c8);
  }
  uStack_90[0x16] = (_func_int *)local_a0;
  pp_Var5 = local_a0[4].super_Connection._vptr_Connection;
  p_Var6 = pp_Var5[3];
  uStack_90[0x17] = pp_Var5[2];
  uStack_90[0x18] = p_Var6;
  local_a0[0x16].super_Connection._vptr_Connection = uStack_90;
  pp_Var5 = *(_func_int ***)(uStack_90[4] + 0x18);
  local_a0[0x17].super_Connection._vptr_Connection = *(_func_int ***)(uStack_90[4] + 0x10);
  local_a0[0x18].super_Connection._vptr_Connection = pp_Var5;
  uStack_90[10] = (_func_int *)(local_a0 + 7);
  local_a0[10].super_Connection._vptr_Connection = uStack_90 + 7;
  pp_Var5 = local_a0[9].super_Connection._vptr_Connection;
  uStack_90[0xb] = (_func_int *)local_a0[8].super_Connection._vptr_Connection;
  uStack_90[0xc] = (_func_int *)pp_Var5;
  pp_Var5 = (_func_int **)uStack_90[9];
  local_a0[0xb].super_Connection._vptr_Connection = (_func_int **)uStack_90[8];
  local_a0[0xc].super_Connection._vptr_Connection = pp_Var5;
  local_88.disposer = local_a8;
  local_88.ptr = local_a0;
  local_a0 = (Connection *)0x0;
  kj::
  ProducerConsumerQueue<kj::Own<capnp::VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>::Connection,_std::nullptr_t>_>
  ::push(&params_1->acceptQueue,&local_88);
  pCVar8 = local_88.ptr;
  if (local_88.ptr != (Connection *)0x0) {
    local_88.ptr = (Connection *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               (_func_int *)
               ((long)&(pCVar8->super_Connection)._vptr_Connection +
               (long)(pCVar8->super_Connection)._vptr_Connection[-2]));
  }
  pCVar8 = local_a0;
  uVar9 = (undefined4)uStack_90;
  uVar10 = uStack_90._4_4_;
  uStack_90 = (_func_int **)0x0;
  *(undefined4 *)&(this->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase =
       local_98.exception._0_4_;
  *(undefined4 *)((long)&(this->super_TestVatBase).super_VatNetworkBase._vptr_VatNetworkBase + 4) =
       local_98.exception._4_4_;
  *(undefined4 *)&this->network = uVar9;
  *(undefined4 *)((long)&this->network + 4) = uVar10;
  if (local_a0 != (Connection *)0x0) {
    local_a0 = (Connection *)0x0;
    (**local_a8->_vptr_Disposer)(local_a8,(long)pCVar8 + *(long *)(*(long *)pCVar8 + -0x10));
  }
LAB_0020424f:
  return (int)this;
}

Assistant:

kj::Maybe<kj::Own<Connection>> connect(test::TestSturdyRefHostId::Reader hostId) override {
    if (hostId.getHost() == self) {
      return kj::none;
    }

    TestVat& dst = KJ_REQUIRE_NONNULL(network.find(hostId.getHost()));

    bool unique = hostId.getUnique();
    if (!unique) {
      KJ_IF_SOME(conn, connections.find(&dst)) {
        // Return existing connection.
        return kj::Own<Connection>(kj::addRef(*conn));
      }
    }

    // Create new connection.
    auto local = kj::refcounted<ConnectionImpl>(*this, dst, self, unique);
    auto remote = kj::refcounted<ConnectionImpl>(dst, *this, dst.self, unique);
    local->attach(*remote);

    dst.acceptQueue.push(kj::mv(remote));
    return kj::Own<Connection>(kj::mv(local));
  }